

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chop.cpp
# Opt level: O1

handle_t handlegraph::algorithms::concat_nodes
                   (MutablePathDeletableHandleGraph *graph,
                   vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *nodes)

{
  handle_t *a;
  handle_t *phVar1;
  pointer phVar2;
  long lVar3;
  long lVar4;
  pointer phVar5;
  bool bVar6;
  char acVar7 [8];
  handle_t hVar8;
  pointer phVar9;
  __node_base _Var10;
  handle_t *n;
  char *pcVar11;
  __node_base _Var12;
  initializer_list<handlegraph::handle_t> __l;
  handle_t new_node;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  right_neighbors;
  vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
  ranges_to_rewrite;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  left_neighbors;
  allocator_type local_261;
  char local_260 [8];
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_258;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_218;
  stringstream *psStack_210;
  code *local_208;
  MutablePathDeletableHandleGraph *pMStack_200;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_1f8;
  char *local_1e0;
  handle_t local_1d8;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_1d0;
  undefined1 local_1b8 [16];
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr ap_Stack_188 [10];
  ios_base local_138 [264];
  
  a = (nodes->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
      _M_impl.super__Vector_impl_data._M_start;
  phVar1 = (nodes->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((a != phVar1) && (bVar6 = operator!=(a,phVar1 + -1), bVar6)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    phVar9 = (nodes->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
    phVar2 = (nodes->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (phVar9 != phVar2) {
      do {
        (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x40))
                  (&local_258,&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),phVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(char *)local_258._M_buckets,local_258._M_bucket_count);
        if ((__node_base *)local_258._M_buckets != &local_258._M_before_begin) {
          operator_delete(local_258._M_buckets,
                          (ulong)((long)&(local_258._M_before_begin._M_nxt)->_M_nxt + 1));
        }
        phVar9 = phVar9 + 1;
      } while (phVar9 != phVar2);
    }
    lVar3 = *(long *)(*(long *)graph + -0x1d0);
    std::__cxx11::stringbuf::str();
    local_260 = (char  [8])
                (**(code **)(*(long *)(&graph->field_0x0 + lVar3) + 0xa0))
                          (&graph->field_0x0 + lVar3,&local_258);
    if ((__node_base *)local_258._M_buckets != &local_258._M_before_begin) {
      operator_delete(local_258._M_buckets,
                      (ulong)((long)&(local_258._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    local_1b8._0_8_ = ap_Stack_188;
    local_1b8._8_8_ = 1;
    local_1a8._M_nxt = (_Hash_node_base *)0x0;
    sStack_1a0 = 0;
    local_198 = 1.0;
    local_190 = 0;
    ap_Stack_188[0] = (__node_base_ptr)0x0;
    local_258._M_buckets = (__buckets_ptr)&local_218;
    local_258._M_bucket_count = 0;
    local_258._M_element_count =
         (size_type)
         std::
         _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
         ::_M_invoke;
    local_258._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
         ::_M_manager;
    local_218 = nodes;
    psStack_210 = (stringstream *)local_1b8;
    local_208 = (code *)local_260;
    pMStack_200 = graph;
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
               (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_start,1,&local_258);
    if (local_258._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)local_258._M_before_begin._M_nxt)(&local_258,&local_258,3);
    }
    local_258._M_buckets = &local_258._M_single_bucket;
    local_258._M_bucket_count = 1;
    local_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_258._M_element_count = 0;
    local_258._M_rehash_policy._M_max_load_factor = 1.0;
    local_258._M_rehash_policy._M_next_resize = 0;
    local_258._M_single_bucket = (__node_base_ptr)0x0;
    psStack_210 = (stringstream *)0x0;
    pMStack_200 = (MutablePathDeletableHandleGraph *)
                  std::
                  _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                  ::_M_invoke;
    local_208 = std::
                _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_manager;
    local_218 = &local_1f8;
    local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)nodes;
    local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)graph;
    local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_258;
    local_1e0 = local_260;
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
               (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1,0);
    if (local_208 != (code *)0x0) {
      (*local_208)(&local_218,&local_218,3);
    }
    if (local_1a8._M_nxt != (_Hash_node_base *)0x0) {
      _Var10._M_nxt = local_1a8._M_nxt;
      do {
        (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0)) + 0xb0))
                  (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0),_Var10._M_nxt + 1,
                   local_260);
        _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
      } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
    }
    if (local_258._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var10._M_nxt = local_258._M_before_begin._M_nxt;
      do {
        (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0)) + 0xb0))
                  (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0),local_260,
                   _Var10._M_nxt + 1);
        _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
      } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
    }
    local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218 = &local_1d0;
    psStack_210 = (stringstream *)0x0;
    pMStack_200 = (MutablePathDeletableHandleGraph *)
                  std::
                  _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                  ::_M_invoke;
    local_208 = std::
                _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_manager;
    local_1d0.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)graph;
    local_1d0.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)nodes;
    local_1d0.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_1f8;
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x168)) + 0x130))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0x168),
               (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_start);
    if (local_208 != (code *)0x0) {
      (*local_208)(&local_218,&local_218,3);
    }
    phVar9 = local_1f8.
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pcVar11 = (local_1f8.
                 super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data;
      do {
        lVar3 = *(long *)(*(long *)graph + -0x1c8);
        acVar7 = local_260;
        if (((pointer)pcVar11)->data[0] == '\x01') {
          lVar4 = *(long *)(*(long *)graph + -0xb0);
          acVar7 = (char  [8])
                   (**(code **)(*(long *)(&graph->field_0x0 + lVar4) + 0x30))
                             (&graph->field_0x0 + lVar4,local_260);
        }
        __l._M_len = 1;
        __l._M_array = &local_1d8;
        local_1d8.data = acVar7;
        std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
                  (&local_1d0,__l,&local_261);
        (**(code **)(*(long *)(&graph->field_0x0 + lVar3) + 0x188))
                  (&local_218,&graph->field_0x0 + lVar3,((pointer)((long)pcVar11 + 0x10))->data + 1,
                   ((pointer)pcVar11)->data + 1,&local_1d0);
        if ((MutablePathDeletableHandleGraph *)
            local_1d0.
            super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
            _M_impl.super__Vector_impl_data._M_start != (MutablePathDeletableHandleGraph *)0x0) {
          operator_delete(local_1d0.
                          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1d0.
                                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d0.
                                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pcVar11 = ((pointer)((long)pcVar11 + 0x20))->data + 1;
      } while ((pointer)pcVar11 != phVar9);
    }
    _Var10._M_nxt = local_1a8._M_nxt;
    if (local_1f8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      _Var10._M_nxt = local_1a8._M_nxt;
    }
    for (; _Var12._M_nxt = local_258._M_before_begin._M_nxt, _Var10._M_nxt != (_Hash_node_base *)0x0
        ; _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0x108))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),_Var10._M_nxt + 1,
                 (nodes->
                 super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                 _M_impl.super__Vector_impl_data._M_start);
    }
    for (; _Var12._M_nxt != (_Hash_node_base *)0x0; _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt) {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0x108))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),
                 (nodes->
                 super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                 _M_impl.super__Vector_impl_data._M_finish + -1,_Var12._M_nxt + 1);
    }
    phVar9 = (nodes->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      phVar2 = phVar9 + 1;
      phVar5 = (nodes->
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (phVar2 == phVar5) break;
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0x108))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),phVar9,phVar2);
      phVar9 = phVar2;
    }
    for (phVar9 = (nodes->
                  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>)
                  ._M_impl.super__Vector_impl_data._M_start; phVar9 != phVar5; phVar9 = phVar9 + 1)
    {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0xf8))
                (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),phVar9);
    }
    std::
    _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_258);
    std::
    _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_1b8);
    hVar8.data[0] = local_260[0];
    hVar8.data[1] = local_260[1];
    hVar8.data[2] = local_260[2];
    hVar8.data[3] = local_260[3];
    hVar8.data[4] = local_260[4];
    hVar8.data[5] = local_260[5];
    hVar8.data[6] = local_260[6];
    hVar8.data[7] = local_260[7];
    return (handle_t)hVar8.data;
  }
  __assert_fail("!nodes.empty() && nodes.front() != nodes.back()",
                "/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/chop.cpp"
                ,0x24,
                "handle_t handlegraph::algorithms::concat_nodes(MutablePathDeletableHandleGraph &, const std::vector<handle_t> &)"
               );
}

Assistant:

handle_t concat_nodes(MutablePathDeletableHandleGraph& graph, const std::vector<handle_t>& nodes) {
    
    // Make sure we have at least 2 nodes
    assert(!nodes.empty() && nodes.front() != nodes.back());
    
    // We also require no edges enter or leave the run of nodes, but we can't check that now.
    
    // Make the new node
    handle_t new_node;
    {
        std::stringstream ss;
        for (auto& n : nodes) {
            ss << graph.get_sequence(n);
        }
        
        new_node = graph.create_handle(ss.str());
    }
    
#ifdef debug
    std::cerr << "Concatenating ";
    for (auto& n : nodes) {
        std::cerr << graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << " ";
    }
    std::cerr << "into " << graph.get_id(new_node) << "+" << std::endl;
#endif
    
    // We should be able to rely on our handle graph to deduplicate edges, but see https://github.com/vgteam/libbdsg/issues/39
    // So we deduplicate ourselves.
    
    // Find all the neighbors. Make sure to translate edges to the other end of
    // the run, or self loops.
    std::unordered_set<handle_t> left_neighbors;
    graph.follow_edges(nodes.front(), true, [&](const handle_t& left_neighbor) {
        if (left_neighbor == nodes.back()) {
            // Loop back to the end
            left_neighbors.insert(new_node);
        } else if (left_neighbor == graph.flip(nodes.front())) {
            // Loop back to the front
            left_neighbors.insert(graph.flip(new_node));
        } else {
            // Normal edge
            left_neighbors.insert(left_neighbor);
        }
    });
    
    std::unordered_set<handle_t> right_neighbors;
    graph.follow_edges(nodes.back(), false, [&](const handle_t& right_neighbor) {
        if (right_neighbor == nodes.front()) {
            // Loop back to the front.
            // We will have seen it from the other side, so ignore it here.
        } else if (right_neighbor == graph.flip(nodes.back())) {
            // Loop back to the end
            right_neighbors.insert(graph.flip(new_node));
        } else {
            // Normal edge
            right_neighbors.insert(right_neighbor);
        }
    });
    
    // Make all the edges, now that we can't interfere with edge listing
    for (auto& n : left_neighbors) {
#ifdef debug
        std::cerr << "Creating edge " << graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << " -> "
        <<  graph.get_id(new_node) << (graph.get_is_reverse(new_node) ? "-" : "+") << std::endl;
#endif
        graph.create_edge(n, new_node);
    }
    for (auto& n : right_neighbors) {
        
#ifdef debug
        std::cerr << "Creating edge " << graph.get_id(new_node) << (graph.get_is_reverse(new_node) ? "-" : "+") << " -> "
        <<  graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << std::endl;
#endif
        
        graph.create_edge(new_node, n);
    }
    
    {
        // Collect the first and last visits along paths. TODO: this requires
        // walking each path all the way through.
        //
        // This contains the first and last handles in path orientation, and a flag
        // for if the path runs along the reverse strand of our run of nodes.
        std::vector<std::tuple<step_handle_t, step_handle_t, bool>> ranges_to_rewrite;
        
        graph.for_each_step_on_handle(nodes.front(), [&](const step_handle_t& front_step) {
            auto path = graph.get_path_handle_of_step(front_step);
#ifdef debug
            std::cerr << "Consider path " << graph.get_path_name(path) << std::endl;
#endif
            
            // If we don't get the same oriented node as where this step is
            // stepping, we must be stepping on the other orientation.
            bool runs_reverse = (graph.get_handle_of_step(front_step) != nodes.front());
            
            step_handle_t back_step = front_step;
            
            while (graph.get_handle_of_step(back_step) !=
                   (runs_reverse ? graph.flip(nodes.back()) : nodes.back())) {
                // Until we find the step on the path that visits the last node in our run.
                // Go along the path towards where our last node should be, in our forward orientation.
                back_step = runs_reverse ? graph.get_previous_step(back_step) : graph.get_next_step(back_step);
            }
            
            // Now we can record the range to rewrite
            // Make sure to put it into path-forward order
            if (runs_reverse) {
#ifdef debug
                std::cerr << "\tGoing to rewrite between " << graph.get_id(graph.get_handle_of_step(front_step)) << " and " << graph.get_id(graph.get_handle_of_step(back_step)) << " backward" << std::endl;
#endif
                ranges_to_rewrite.emplace_back(back_step, front_step, true);
            } else {
                
#ifdef debug
                std::cerr << "\tGoing to rewrite between " << graph.get_id(graph.get_handle_of_step(front_step)) << " and " << graph.get_id(graph.get_handle_of_step(back_step)) << std::endl;
#endif
                ranges_to_rewrite.emplace_back(front_step, back_step, false);
            }
        });
        
        uint64_t i = 0;
        for (auto& range : ranges_to_rewrite) {
            // Rewrite each range to visit the new node in the appropriate orientation instead of whatever it did before
            // Make sure to advance the end of the range because rewrite is end-exclusive (to allow insert).
            graph.rewrite_segment(std::get<0>(range), std::get<1>(range),
                                  {std::get<2>(range) ? graph.flip(new_node) : new_node});
        }
    }
    
    // Destroy all the old edges
    // We know they only exist to the left and right neighbors, and along the run
    for (auto& n : left_neighbors) {
        graph.destroy_edge(n, nodes.front());
    }
    for (auto& n : right_neighbors) {
        graph.destroy_edge(nodes.back(), n);
    }
    auto it = nodes.begin();
    auto next_it = it;
    ++next_it;
    while (next_it != nodes.end()) {
        graph.destroy_edge(*it, *next_it);
        it = next_it;
        ++next_it;
    }
    
    for (auto& n : nodes) {
        // Destroy all the old nodes
#ifdef debug
        std::cerr << "Destroying node " << graph.get_id(n) << std::endl;
#endif
        graph.destroy_handle(n);
    }
    
    /*
     #ifdef debug
     std::cerr << "Paths after concat: " << std::endl;
     graph.for_each_path_handle([&](const path_handle_t p) {
     std::cerr << graph.get_path_name(p) << ": ";
     for (auto h : graph.scan_path(p)) {
     std::cerr << graph.get_id(h) << (graph.get_is_reverse(h) ? '-' : '+') << " ";
     }
     std::cerr << std::endl;
     });
     #endif
     */
    
    // Return the new handle we merged to.
    return new_node;
}